

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O1

DecodeStatus DecodeMemMMSPImm5Lsl2(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  DecodeStatus extraout_EAX;
  MCRegisterClass *pMVar1;
  
  pMVar1 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,8);
  MCOperand_CreateReg0(Inst,(uint)*(ushort *)((long)pMVar1->RegsBegin + (ulong)(Insn >> 4 & 0x3e)));
  MCOperand_CreateReg0(Inst,0x14);
  MCOperand_CreateImm0(Inst,(ulong)((Insn & 0x1f) << 2));
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeMemMMSPImm5Lsl2(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	unsigned Offset = Insn & 0x1F;
	unsigned Reg = fieldFromInstruction(Insn, 5, 5);

	Reg = getReg(Decoder, Mips_GPR32RegClassID, Reg);

	MCOperand_CreateReg0(Inst, Reg);
	MCOperand_CreateReg0(Inst, Mips_SP);
	MCOperand_CreateImm0(Inst, Offset << 2);

	return MCDisassembler_Success;
}